

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_19bca9::RandomReadingTask::execute(RandomReadingTask *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int lx_00;
  int rx;
  int ly_00;
  int ry;
  reference pvVar6;
  long in_RDI;
  Box2i b2;
  Box2i b1;
  FrameBuffer frameBuffer_1;
  int numYTiles;
  int numXTiles;
  int h;
  int w;
  int numYLevels;
  int numXLevels;
  lock_guard<std::mutex> lock_1;
  TiledInputPart part_1;
  int ly;
  int lx;
  int ty2;
  int ty1;
  int tx2;
  int tx1;
  FrameBuffer frameBuffer;
  lock_guard<std::mutex> lock;
  InputPart part;
  int l2;
  int l1;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  int levelMode;
  int pixelType;
  int partType;
  int partNumber;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  undefined8 in_stack_fffffffffffffe60;
  undefined1 *puVar7;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [48];
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  TiledInputPart local_d8 [4];
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  int iVar8;
  int in_stack_ffffffffffffff3c;
  int iVar9;
  int in_stack_ffffffffffffff40;
  int iVar10;
  int in_stack_ffffffffffffff44;
  int iVar11;
  int in_stack_ffffffffffffff4c;
  FrameBuffer *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff60;
  undefined1 local_80 [56];
  Array2D<float> local_48;
  Array2D<unsigned_int> local_30;
  value_type local_18;
  value_type local_14;
  value_type local_10;
  int local_c;
  
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
             (anonymous_namespace)::headers);
  local_c = random_int(in_stack_fffffffffffffe54);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::partTypes,
                      (long)local_c);
  local_10 = *pvVar6;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                      (long)local_c);
  local_14 = *pvVar6;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::levelModes,
                      (long)local_c);
  local_18 = *pvVar6;
  Imf_3_4::Array2D<unsigned_int>::Array2D(&local_30);
  Imf_3_4::Array2D<float>::Array2D(&local_48);
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D((Array2D<Imath_3_2::half> *)(local_80 + 0x10));
  if (local_10 == 0) {
    local_80._12_4_ = random_int(in_stack_fffffffffffffe54);
    local_80._8_4_ = random_int(in_stack_fffffffffffffe54);
    if ((int)local_80._8_4_ < (int)local_80._12_4_) {
      std::swap<int>((int *)(local_80 + 0xc),(int *)(local_80 + 8));
    }
    Imf_3_4::InputPart::InputPart
              ((InputPart *)local_80,*(MultiPartInputFile **)(in_RDI + 0x10),local_c);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (mutex_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1cff35);
    setInputFrameBuffer(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                        (Array2D<unsigned_int> *)
                        CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (Array2D<float> *)
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        (Array2D<Imath_3_2::half> *)
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff2c,in_stack_ffffffffffffff60);
    Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)local_80);
    Imf_3_4::InputPart::readPixels((int)local_80,local_80._12_4_);
    iVar3 = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
    if (local_14 == 0) {
      bVar1 = anon_unknown.dwarf_19bca9::checkPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),iVar3,
                         (int)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                         in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int> ( uData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x12f,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if (local_14 == 1) {
      bVar1 = anon_unknown.dwarf_19bca9::checkPixels<float>
                        ((Array2D<float> *)
                         CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),iVar3,
                         (int)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                         in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
      if (!bVar1) {
        __assert_fail("checkPixels<float> ( fData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x133,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if ((local_14 == 2) &&
            (bVar1 = anon_unknown.dwarf_19bca9::checkPixels<Imath_3_2::half>
                               ((Array2D<Imath_3_2::half> *)
                                CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                                in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,
                                in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,iVar3), !bVar1))
    {
      __assert_fail("checkPixels<half> (hData, 0, width - 1, l1, l2, width)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x137,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
    }
    Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1d012c);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1d0139);
  }
  else {
    Imf_3_4::TiledInputPart::TiledInputPart
              (local_d8,*(MultiPartInputFile **)(in_RDI + 0x10),local_c);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (mutex_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    local_e4 = Imf_3_4::TiledInputPart::numXLevels();
    local_e8 = Imf_3_4::TiledInputPart::numYLevels();
    iVar2 = random_int(in_stack_fffffffffffffe54);
    iVar3 = random_int(in_stack_fffffffffffffe54);
    if (local_18 == 1) {
      iVar3 = iVar2;
    }
    local_ec = Imf_3_4::TiledInputPart::levelWidth((int)local_d8);
    local_f0 = Imf_3_4::TiledInputPart::levelHeight((int)local_d8);
    uVar4 = Imf_3_4::TiledInputPart::numXTiles((int)local_d8);
    local_f4 = uVar4;
    uVar5 = Imf_3_4::TiledInputPart::numYTiles((int)local_d8);
    local_f8 = uVar5;
    lx_00 = random_int(in_stack_fffffffffffffe54);
    iVar11 = lx_00;
    rx = random_int(in_stack_fffffffffffffe54);
    iVar10 = rx;
    ly_00 = random_int(in_stack_fffffffffffffe54);
    iVar9 = ly_00;
    ry = random_int(in_stack_fffffffffffffe54);
    iVar8 = ry;
    if (iVar10 < iVar11) {
      std::swap<int>((int *)&stack0xffffffffffffff44,(int *)&stack0xffffffffffffff40);
    }
    if (iVar8 < iVar9) {
      std::swap<int>((int *)&stack0xffffffffffffff3c,(int *)&stack0xffffffffffffff38);
    }
    puVar7 = local_128;
    Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1d0390);
    setInputFrameBuffer(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                        (Array2D<unsigned_int> *)CONCAT44(iVar11,iVar10),
                        (Array2D<float> *)CONCAT44(iVar9,iVar8),
                        (Array2D<Imath_3_2::half> *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffff2c,
                        in_stack_ffffffffffffff60);
    Imf_3_4::TiledInputPart::setFrameBuffer((FrameBuffer *)local_d8);
    Imf_3_4::TiledInputPart::readTiles((int)local_d8,iVar11,iVar10,iVar9,iVar8,iVar2);
    Imf_3_4::TiledInputPart::dataWindowForTile((int)local_138,(int)local_d8,iVar11,iVar9);
    Imf_3_4::TiledInputPart::dataWindowForTile((int)local_148,(int)local_d8,iVar10,iVar8);
    iVar3 = (int)((ulong)puVar7 >> 0x20);
    if (local_14 == 0) {
      bVar1 = anon_unknown.dwarf_19bca9::checkPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)CONCAT44(ly_00,ry),iVar3,(int)puVar7,0,
                         in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int> ( uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x168,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if (local_14 == 1) {
      bVar1 = anon_unknown.dwarf_19bca9::checkPixels<float>
                        ((Array2D<float> *)CONCAT44(ly_00,ry),iVar3,(int)puVar7,1,
                         in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
      if (!bVar1) {
        __assert_fail("checkPixels<float> ( fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x16c,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if ((local_14 == 2) &&
            (bVar1 = anon_unknown.dwarf_19bca9::checkPixels<Imath_3_2::half>
                               ((Array2D<Imath_3_2::half> *)CONCAT44(uVar4,uVar5),lx_00,rx,ly_00,ry,
                                iVar3), !bVar1)) {
      __assert_fail("checkPixels<half> ( hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x170,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
    }
    Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1d0612);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1d061f);
  }
  Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  Imf_3_4::Array2D<float>::~Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  Imf_3_4::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50))
  ;
  return;
}

Assistant:

void execute ()
    {
        int partNumber = random_int (headers.size ());
        int partType   = partTypes[partNumber];
        int pixelType  = pixelTypes[partNumber];
        int levelMode  = levelModes[partNumber];

        Array2D<unsigned int> uData;
        Array2D<float>        fData;
        Array2D<half>         hData;
        if (partType == 0)
        {
            int l1, l2;
            l1 = random_int (height);
            l2 = random_int (height);
            if (l1 > l2) swap (l1, l2);

            InputPart part (*file, partNumber);
            //
            // We add lock here to assure that two threads that accessing
            // the same part won't mess things up.
            //
            std::lock_guard<std::mutex> lock (mutexes[partNumber]);

            FrameBuffer frameBuffer;
            setInputFrameBuffer (
                frameBuffer, pixelType, uData, fData, hData, width, height);

            part.setFrameBuffer (frameBuffer);
            part.readPixels (l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        uData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        fData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert (
                        checkPixels<half> (hData, 0, width - 1, l1, l2, width));
                    break;
            }
        }
        else
        {
            int tx1, tx2, ty1, ty2;
            int lx, ly;

            TiledInputPart part (*file, partNumber);
            //
            // We add lock here to assure that two threads that accessing
            // the same part won't mess things up.
            //
            std::lock_guard<std::mutex> lock (mutexes[partNumber]);

            int numXLevels = part.numXLevels ();
            int numYLevels = part.numYLevels ();

            lx = random_int (numXLevels);
            ly = random_int (numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth (lx);
            int h = part.levelHeight (ly);

            int numXTiles = part.numXTiles (lx);
            int numYTiles = part.numYTiles (ly);
            tx1           = random_int (numXTiles);
            tx2           = random_int (numXTiles);
            ty1           = random_int (numYTiles);
            ty2           = random_int (numYTiles);
            if (tx1 > tx2) swap (tx1, tx2);
            if (ty1 > ty2) swap (ty1, ty2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer (
                frameBuffer, pixelType, uData, fData, hData, w, h);

            part.setFrameBuffer (frameBuffer);
            part.readTiles (tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile (tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile (tx2, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 2:
                    assert (checkPixels<half> (
                        hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
            }
        }
    }